

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O2

StructReader * __thiscall
capnp::_::PointerReader::getStruct
          (StructReader *__return_storage_ptr__,PointerReader *this,word *defaultValue)

{
  WirePointer *pWVar1;
  WirePointer *pWVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  word *pwVar6;
  CapTableReader *pCVar7;
  Arena *pAVar8;
  ulong uVar9;
  int iVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SegmentReader *pSVar11;
  ulong uVar12;
  WirePointer *pWVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  WirePointer *pWVar18;
  Fault f;
  
  pWVar18 = (WirePointer *)&(anonymous_namespace)::zero;
  if (this->pointer != (WirePointer *)0x0) {
    pWVar18 = this->pointer;
  }
  pSVar11 = this->segment;
  pWVar1 = pWVar18 + 1;
  uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
  lVar15 = (long)((int)uVar14 >> 2);
  pWVar13 = pWVar1 + lVar15;
  if (((pSVar11 != (SegmentReader *)0x0) &&
      (pwVar6 = (pSVar11->ptr).ptr, pWVar2 = (WirePointer *)(pwVar6 + (pSVar11->ptr).size_),
      pWVar13 = pWVar2, (long)pwVar6 - (long)pWVar1 >> 3 <= lVar15)) &&
     (pWVar13 = pWVar1 + lVar15, (long)pWVar2 - (long)pWVar1 >> 3 < lVar15)) {
    pWVar13 = pWVar2;
  }
  pCVar7 = this->capTable;
  iVar5 = this->nestingLimit;
  if ((pWVar18->field_1).upper32Bits == 0 && uVar14 == 0) goto LAB_002384d8;
  if (iVar5 < 1) goto LAB_002385af;
  if (pSVar11 == (SegmentReader *)0x0) {
    pSVar11 = (SegmentReader *)0x0;
LAB_002383d9:
    if (pWVar13 == (WirePointer *)0x0) goto LAB_002384d8;
  }
  else {
    if ((uVar14 & 3) != 2) goto LAB_002383d9;
    iVar10 = (*pSVar11->arena->_vptr_Arena[2])();
    pSVar11 = (SegmentReader *)CONCAT44(extraout_var,iVar10);
    if (pSVar11 == (SegmentReader *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x234,FAILED,"segment != nullptr",
                 "\"Message contains far pointer to unknown segment.\"",
                 (char (*) [49])"Message contains far pointer to unknown segment.");
      goto LAB_00238655;
    }
    uVar16 = (pSVar11->ptr).size_;
    uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
    uVar12 = (ulong)(uVar14 >> 3);
    if ((long)uVar16 < (long)(ulong)(uVar14 >> 3)) {
      uVar12 = uVar16;
    }
    uVar17 = 2 - (ulong)((uVar14 & 4) == 0);
    if (uVar16 < uVar12 + uVar17) {
LAB_0023842d:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[44]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x23c,FAILED,"boundsCheck(segment, ptr, padWords)",
                 "\"Message contains out-of-bounds far pointer.\"",
                 (char (*) [44])"Message contains out-of-bounds far pointer.");
      goto LAB_00238655;
    }
    pwVar6 = (pSVar11->ptr).ptr;
    pAVar8 = pSVar11->arena;
    uVar9 = pSVar11->readLimiter->limit;
    if (uVar9 < uVar17) {
      (*pAVar8->_vptr_Arena[3])();
      goto LAB_0023842d;
    }
    pWVar18 = (WirePointer *)(pwVar6 + uVar12);
    pWVar1 = pWVar18 + 1;
    pSVar11->readLimiter->limit = uVar9 - uVar17;
    if ((uVar14 & 4) != 0) {
      iVar10 = (*pAVar8->_vptr_Arena[2])(pAVar8,(ulong)(pWVar18->field_1).upper32Bits);
      pSVar11 = (SegmentReader *)CONCAT44(extraout_var_00,iVar10);
      if (pSVar11 == (SegmentReader *)0x0) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[56]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x24e,FAILED,"newSegment != nullptr",
                   "\"Message contains double-far pointer to unknown segment.\"",
                   (char (*) [56])"Message contains double-far pointer to unknown segment.");
        goto LAB_00238655;
      }
      uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
      if ((uVar14 & 3) != 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[51]>
                  (&f,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x252,FAILED,"pad->kind() == WirePointer::FAR",
                   "\"Second word of double-far pad must be far pointer.\"",
                   (char (*) [51])"Second word of double-far pad must be far pointer.");
        goto LAB_00238655;
      }
      uVar12 = (ulong)(uVar14 >> 3);
      uVar16 = (pSVar11->ptr).size_;
      if ((long)uVar16 < (long)uVar12) {
        uVar12 = uVar16;
      }
      pWVar13 = (WirePointer *)((pSVar11->ptr).ptr + uVar12);
      pWVar18 = pWVar1;
      goto LAB_002383d9;
    }
    uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
    lVar15 = (long)((int)uVar14 >> 2);
    pWVar13 = (WirePointer *)(pwVar6 + uVar16);
    if (((long)pwVar6 - (long)pWVar1 >> 3 <= lVar15) &&
       (lVar15 <= (long)pWVar13 - (long)pWVar1 >> 3)) {
      pWVar13 = pWVar1 + lVar15;
      goto LAB_00238516;
    }
  }
  uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value;
LAB_00238516:
  do {
    if ((uVar14 & 3) == 0) {
      uVar3 = *(ushort *)&pWVar18->field_1;
      uVar4 = (pWVar18->field_1).structRef.ptrCount.value;
      if (pSVar11 == (SegmentReader *)0x0) {
LAB_00238563:
        __return_storage_ptr__->segment = pSVar11;
        __return_storage_ptr__->capTable = pCVar7;
        __return_storage_ptr__->data = pWVar13;
        __return_storage_ptr__->pointers = pWVar13 + uVar3;
        __return_storage_ptr__->dataSize = (uint)uVar3 << 6;
        __return_storage_ptr__->pointerCount = uVar4;
        __return_storage_ptr__->nestingLimit = iVar5 + -1;
        return __return_storage_ptr__;
      }
      uVar16 = (ulong)uVar4 + (ulong)uVar3;
      if (((long)pWVar13 - (long)(pSVar11->ptr).ptr >> 3) + uVar16 <= (pSVar11->ptr).size_) {
        uVar12 = pSVar11->readLimiter->limit;
        if (uVar16 <= uVar12) {
          pSVar11->readLimiter->limit = uVar12 - uVar16;
          goto LAB_00238563;
        }
        (*pSVar11->arena->_vptr_Arena[3])();
      }
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[48]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x87e,FAILED,"boundsCheck(segment, ptr, ref->structRef.wordSize())",
                 "\"Message contained out-of-bounds struct pointer.\"",
                 (char (*) [48])"Message contained out-of-bounds struct pointer.");
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[71]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x879,FAILED,"ref->kind() == WirePointer::STRUCT",
                 "\"Message contains non-struct pointer where struct pointer was expected.\"",
                 (char (*) [71])
                 "Message contains non-struct pointer where struct pointer was expected.");
    }
LAB_00238655:
    while( true ) {
      kj::_::Debug::Fault::~Fault(&f);
LAB_002384d8:
      pWVar18 = (WirePointer *)defaultValue;
      if ((pWVar18 == (WirePointer *)0x0) ||
         (uVar14 = (uint)*(uint64_t *)&(pWVar18->offsetAndKind).value,
         (pWVar18->field_1).upper32Bits == 0 && uVar14 == 0)) {
        __return_storage_ptr__->data = (void *)0x0;
        __return_storage_ptr__->pointers = (WirePointer *)0x0;
        __return_storage_ptr__->segment = (SegmentReader *)0x0;
        __return_storage_ptr__->capTable = (CapTableReader *)0x0;
        *(undefined8 *)((long)&__return_storage_ptr__->pointers + 6) = 0;
        __return_storage_ptr__->nestingLimit = 0x7fffffff;
        return __return_storage_ptr__;
      }
      pWVar13 = pWVar18 + (long)((int)uVar14 >> 2) + 1;
      defaultValue = (word *)0x0;
      pSVar11 = (SegmentReader *)0x0;
      if (0 < iVar5) break;
LAB_002385af:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[76]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                 ,0x86d,FAILED,"nestingLimit > 0",
                 "\"Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.\"",
                 (char (*) [76])
                 "Message is too deeply-nested or contains cycles.  See capnp::ReaderOptions.");
    }
  } while( true );
}

Assistant:

StructReader PointerReader::getStruct(const word* defaultValue) const {
  const WirePointer* ref = pointer == nullptr ? &zero.pointer : pointer;
  return WireHelpers::readStructPointer(segment, capTable, ref, defaultValue, nestingLimit);
}